

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader.hpp
# Opt level: O2

uchar __thiscall
duckdb::BitReader::ReadBytes<unsigned_char,(unsigned_char)0>(BitReader *this,uint8_t *remainder)

{
  undefined1 in_AL;
  uint8_t uVar1;
  undefined7 in_register_00000001;
  undefined8 uStack_18;
  
  uStack_18 = CONCAT71(in_register_00000001,in_AL) & 0xffffffffffffff;
  uVar1 = InnerRead(this,remainder,(uint8_t *)((long)&uStack_18 + 7));
  this->index = this->index + (uint)*remainder;
  return uVar1;
}

Assistant:

inline T ReadBytes(const uint8_t &remainder) {
		T result = 0;
		if (BYTES > 0) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(0));
		}
		if (BYTES > 1) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(1));
		}
		if (BYTES > 2) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(2));
		}
		if (BYTES > 3) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(3));
		}
		if (BYTES > 4) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(4));
		}
		if (BYTES > 5) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(5));
		}
		if (BYTES > 6) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(6));
		}
		if (BYTES > 7) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(7));
		}
		result = UnsafeNumericCast<T>(result << remainder | InnerRead(remainder, BYTES));
		index += (BYTES << 3) + remainder;
		return result;
	}